

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::SubmitExtraFiles(cmCTest *this,VectorOfStrings *files)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream cmCTestLog_msg;
  __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_38;
  String *local_30;
  __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_28;
  const_iterator it;
  VectorOfStrings *files_local;
  cmCTest *this_local;
  
  it._M_current = (String *)files;
  __gnu_cxx::
  __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  ::__normal_iterator(&local_28);
  local_30 = (String *)
             std::vector<cmsys::String,_std::allocator<cmsys::String>_>::begin
                       ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)it._M_current);
  local_28._M_current = local_30;
  while( true ) {
    local_38._M_current =
         (String *)
         std::vector<cmsys::String,_std::allocator<cmsys::String>_>::end
                   ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
    ::operator->(&local_28);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
    ::operator->(&local_28);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    AddSubmitFile(this,PartExtraFiles,pcVar2);
    __gnu_cxx::
    __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
    ::operator++(&local_28);
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar3 = std::operator<<((ostream *)local_1b0,"Cannot find extra file: ");
  psVar4 = (string *)
           __gnu_cxx::
           __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
           ::operator*(&local_28);
  poVar3 = std::operator<<(poVar3,psVar4);
  poVar3 = std::operator<<(poVar3," to submit.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  Log(this,6,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x5fa,pcVar2,false);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return false;
}

Assistant:

bool cmCTest::SubmitExtraFiles(const VectorOfStrings& files)
{
  VectorOfStrings::const_iterator it;
  for (it = files.begin(); it != files.end(); ++it) {
    if (!cmSystemTools::FileExists(it->c_str())) {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot find extra file: "
                   << *it << " to submit." << std::endl;);
      return false;
    }
    this->AddSubmitFile(PartExtraFiles, it->c_str());
  }
  return true;
}